

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelValues * __thiscall
pbrt::Image::MRSE(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,
                 Image *ref,Image *mrseImage)

{
  float fVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  size_t sVar3;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar4;
  float fVar5;
  ImageChannelDesc *pIVar6;
  Allocator alloc;
  ulong uVar7;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  ulong uVar10;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar11;
  long lVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first;
  size_t sVar14;
  Point2i PVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator_type local_201;
  long local_200;
  ImageChannelDesc *local_1f8;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Image *local_1c0;
  vector<double,_std::allocator<double>_> sumRSE;
  ImageChannelDesc refDesc;
  ColorEncodingHandle local_150;
  Point2i va;
  int local_140;
  undefined4 uStack_13c;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  ColorEncodingHandle local_98;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_90;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_70;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_50;
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumRSE,(desc->offset).nStored,(value_type_conflict2 *)&va,(allocator_type *)&refDesc);
  local_1f8 = desc;
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n =
       CONCAT44(uStack_13c,local_140) - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    LogFatal<char_const(&)[14]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x266,"Check failed: %s",(char (*) [14])"(bool)refDesc");
  }
  TVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (ref->resolution).super_Tuple2<pbrt::Point2,_int>;
  auVar16._8_8_ = 0;
  auVar16._0_4_ = TVar2.x;
  auVar16._4_4_ = TVar2.y;
  auVar17._8_8_ = 0;
  auVar17._0_4_ = vb.super_Tuple2<pbrt::Point2,_int>.x;
  auVar17._4_4_ = vb.super_Tuple2<pbrt::Point2,_int>.y;
  uVar7 = vpcmpd_avx512vl(auVar16,auVar17,4);
  va.super_Tuple2<pbrt::Point2,_int> = TVar2;
  if ((uVar7 & 3) == 0) {
    local_1c0 = this;
    if (mrseImage != (Image *)0x0) {
      pbVar9 = (this->channelNames).ptr;
      __first = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(this->channelNames).field_2;
      if (pbVar9 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        __first = pbVar9;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<std::__cxx11::string_const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vb,__first,
                 __first + (this->channelNames).nStored,&local_201);
      PVar15.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      lVar12 = (long)local_1e8 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      local_150.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar12 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar15.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar2,channels,&local_150,alloc);
      (mrseImage->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_140;
      mrseImage->format = va.super_Tuple2<pbrt::Point2,_int>.x;
      (mrseImage->resolution).super_Tuple2<pbrt::Point2,_int>.x =
           va.super_Tuple2<pbrt::Point2,_int>.y;
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&mrseImage->channelNames,&local_138);
      (mrseImage->encoding).
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (uintptr_t)
              local_98.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&mrseImage->p8,&local_90);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&mrseImage->p16,&local_70);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&mrseImage->p32,&local_50);
      local_50.nStored = 0;
      (*(local_50.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_50.alloc.memoryResource,local_50.ptr,local_50.nAlloc << 2,4);
      this = local_1c0;
      local_70.nStored = 0;
      (*(local_70.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_70.alloc.memoryResource,local_70.ptr,local_70.nAlloc * 2,2);
      local_90.nStored = 0;
      (*(local_90.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_90.alloc.memoryResource,local_90.ptr,local_90.nAlloc);
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
    }
    if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y) {
      local_200 = 0;
      do {
        if (0 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
          uVar7 = local_200 << 0x20;
          uVar10 = 0;
          do {
            pIVar6 = local_1f8;
            PVar15.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar7 | uVar10);
            GetChannels((ImageChannelValues *)&va,this,PVar15,local_1f8,(WrapMode2D)0x200000002);
            GetChannels((ImageChannelValues *)&vb,ref,PVar15,&refDesc,(WrapMode2D)0x200000002);
            if ((pIVar6->offset).nStored != 0) {
              uVar13 = 0;
              do {
                pIVar8 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(uStack_13c,local_140);
                if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(uStack_13c,local_140) ==
                    (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
                  pIVar8 = &local_138;
                }
                pbVar9 = local_1e8;
                if (local_1e8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pbVar9 = &local_1e0;
                }
                fVar1 = *(float *)((long)&(pbVar9->_M_dataplus)._M_p + uVar13 * 4);
                fVar5 = *(float *)((long)&(pIVar8->alloc).memoryResource + uVar13 * 4) - fVar1;
                fVar1 = fVar1 + 0.01;
                fVar1 = (fVar5 * fVar5) / (fVar1 * fVar1);
                if ((ABS(fVar1) != INFINITY) &&
                   (sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar13] =
                         (double)fVar1 +
                         sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13], mrseImage != (Image *)0x0)) {
                  SetChannel(mrseImage,PVar15,(int)uVar13,fVar1);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 < (local_1f8->offset).nStored);
            }
            local_1e0.field_2._8_8_ = 0;
            (**(code **)(*(long *)vb.super_Tuple2<pbrt::Point2,_int> + 0x18))
                      (vb.super_Tuple2<pbrt::Point2,_int>,local_1e8,
                       local_1e0.field_2._M_allocated_capacity << 2,4);
            local_138.field_2.fixed[0]._M_string_length = 0;
            (**(code **)(*(long *)va.super_Tuple2<pbrt::Point2,_int> + 0x18))
                      (va.super_Tuple2<pbrt::Point2,_int>,CONCAT44(uStack_13c,local_140),
                       (long)local_138.field_2.fixed[0]._M_dataplus._M_p << 2,4);
            uVar10 = uVar10 + 1;
            this = local_1c0;
          } while ((long)uVar10 < (long)(local_1c0->resolution).super_Tuple2<pbrt::Point2,_int>.x);
        }
        local_200 = local_200 + 1;
      } while (local_200 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
    pIVar6 = local_1f8;
    sVar3 = (local_1f8->offset).nStored;
    vb.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int> & 0xffffffff00000000;
    va.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pstd::pmr::new_delete_resource()
    ;
    InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
              (&__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,sVar3,
               (float *)&vb,(polymorphic_allocator<float> *)&va);
    sVar3 = (pIVar6->offset).nStored;
    if (sVar3 != 0) {
      paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      paVar11 = &(__return_storage_ptr__->
                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      if (paVar4 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar11 = paVar4;
      }
      sVar14 = 0;
      do {
        TVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
        paVar11->fixed[sVar14] =
             (float)(sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar14] / (double)(TVar2.y * TVar2.x));
        sVar14 = sVar14 + 1;
      } while (sVar3 != sVar14);
    }
    refDesc.offset.nStored = 0;
    (*(refDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (refDesc.offset.alloc.memoryResource,refDesc.offset.ptr,refDesc.offset.nAlloc << 2,4);
    if (sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x267,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x4cf282,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x4cf282,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::MRSE(const ImageChannelDesc &desc, const Image &ref,
                               Image *mrseImage) const {
    std::vector<double> sumRSE(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    CHECK((bool)refDesc);
    CHECK_EQ(Resolution(), ref.Resolution());

    if (mrseImage)
        *mrseImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float rse = Sqr(v[c] - vref[c]) / Sqr(vref[c] + 0.01);
                if (std::isinf(rse))
                    continue;
                sumRSE[c] += rse;
                if (mrseImage)
                    mrseImage->SetChannel({x, y}, c, rse);
            }
        }

    ImageChannelValues mrse(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        mrse[c] = sumRSE[c] / (Resolution().x * Resolution().y);
    return mrse;
}